

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O0

WasmSplitOptions * __thiscall
wasm::WasmSplitOptions::add
          (WasmSplitOptions *this,string *longName,string *shortName,string *description,
          string *category,Arguments arguments,Action *action)

{
  string *category_00;
  string *description_00;
  string *shortName_00;
  string *longName_00;
  reference this_00;
  WasmSplitOptions *pWVar1;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_68;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  undefined1 local_40;
  uint local_38;
  Arguments local_34;
  uint i;
  Arguments arguments_local;
  string *category_local;
  string *description_local;
  string *shortName_local;
  string *longName_local;
  WasmSplitOptions *this_local;
  
  local_34 = arguments;
  _i = category;
  category_local = description;
  description_local = shortName;
  shortName_local = longName;
  longName_local = (string *)this;
  for (local_38 = 0; longName_00 = shortName_local, shortName_00 = description_local,
      description_00 = category_local, category_00 = _i, local_38 < 4; local_38 = local_38 + 1) {
    this_00 = std::
              array<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
              ::operator[](&this->validOptions,(ulong)local_38);
    pVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(this_00,shortName_local);
    local_48._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_40 = pVar2.second;
  }
  local_68.
  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_68);
  pWVar1 = add(this,longName_00,shortName_00,description_00,category_00,&local_68,local_34,action);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_68);
  return pWVar1;
}

Assistant:

WasmSplitOptions& WasmSplitOptions::add(const std::string& longName,
                                        const std::string& shortName,
                                        const std::string& description,
                                        const std::string& category,
                                        Arguments arguments,
                                        const Action& action) {
  // Add an option valid in all modes.
  for (unsigned i = 0; i < NumModes; ++i) {
    validOptions[i].insert(longName);
  }
  return add(longName, shortName, description, category, {}, arguments, action);
}